

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O1

SIMDValue Js::SIMDInt8x16Operation::OpInt8x16(int8 *values)

{
  return (SIMDValue)*(anon_union_16_9_4d7543c8_for__SIMDValue_0 *)values;
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpInt8x16(int8 values[])
    {
        X86SIMDValue x86Result;
        // Sets the 16 signed 8-bit integer values, note in revised order: starts with x15 below
        x86Result.m128i_value = _mm_set_epi8(values[15], values[14], values[13], values[12],
                                             values[11], values[10], values[9], values[8],
                                             values[7], values[6], values[5], values[4],
                                             values[3], values[2], values[1], values[0]);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }